

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_maps.hpp
# Opt level: O2

void __thiscall PatchOptimizeMaps::alter_world(PatchOptimizeMaps *this,World *world)

{
  Map *pMVar1;
  
  clear_unreachable_maps(world);
  remove_useless_entities(world);
  optimize_palettes_usage(world);
  optimize_map_connections(world);
  pMVar1 = World::map(world,0x36);
  transform_variant_into_standard(pMVar1);
  pMVar1 = World::map(world,0x270);
  transform_variant_into_standard(pMVar1);
  pMVar1 = World::map(world,0x2be);
  transform_variant_into_standard(pMVar1);
  remove_useless_map_variants(world);
  return;
}

Assistant:

void alter_world(World& world) override
    {
        clear_unreachable_maps(world);
        remove_useless_entities(world);
        optimize_palettes_usage(world);
        optimize_map_connections(world);

        transform_variant_into_standard(world.map(MAP_MERCATOR_CASTLE_THRONE_ROOM_ARTHUR_VARIANT));
        transform_variant_into_standard(world.map(MAP_RYUMA_INN_VARIANT));
        transform_variant_into_standard(world.map(MAP_MERCATOR_HOTEL_VARIANT));

        remove_useless_map_variants(world);
    }